

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

_Bool m68k_cpu_exec_interrupt_m68k(CPUState *cs,int interrupt_request)

{
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  int interrupt_request_local;
  CPUState *cs_local;
  
  if (((interrupt_request & 2U) == 0) ||
     (*(uint *)(cs[1].tb_jmp_cache + 0xc0) <=
      (*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) & 0x700) >> 8)) {
    cs_local._7_1_ = false;
  }
  else {
    cs->exception_index = *(int32_t *)((long)cs[1].tb_jmp_cache + 0x5fc);
    do_interrupt_m68k_hardirq((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f));
    cs_local._7_1_ = true;
  }
  return cs_local._7_1_;
}

Assistant:

bool m68k_cpu_exec_interrupt(CPUState *cs, int interrupt_request)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    if (interrupt_request & CPU_INTERRUPT_HARD
        && ((env->sr & SR_I) >> SR_I_SHIFT) < env->pending_level) {
        /*
         * Real hardware gets the interrupt vector via an IACK cycle
         * at this point.  Current emulated hardware doesn't rely on
         * this, so we provide/save the vector when the interrupt is
         * first signalled.
         */
        cs->exception_index = env->pending_vector;
        do_interrupt_m68k_hardirq(env);
        return true;
    }
    return false;
}